

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O0

pint p_test_case_sha2_224_test(void)

{
  pint pVar1;
  puchar local_78 [8];
  puchar hash_etalon_3 [28];
  puchar hash_etalon_2 [28];
  puchar hash_etalon_1 [28];
  
  p_test_module_fail_counter = 0;
  stack0xffffffffffffffc8 = 0x22d80534227d0923;
  stack0xffffffffffffffa8 = 0xcc762751168b3875;
  hash_etalon_2[0] = ']';
  hash_etalon_2[1] = 0xba;
  hash_etalon_2[2] = ']';
  hash_etalon_2[3] = 0xa1;
  hash_etalon_2[4] = 0xfd;
  hash_etalon_2[5] = 0x89;
  hash_etalon_2[6] = '\x01';
  hash_etalon_2[7] = 'P';
  hash_etalon_2[8] = 0xb0;
  hash_etalon_2[9] = 0xc6;
  hash_etalon_2[10] = 'E';
  hash_etalon_2[0xb] = '\\';
  hash_etalon_2[0xc] = 0xb4;
  hash_etalon_2[0xd] = 0xf5;
  hash_etalon_2[0xe] = 0x8b;
  hash_etalon_2[0xf] = '\x19';
  hash_etalon_2[0x10] = 'R';
  hash_etalon_2[0x11] = 'R';
  hash_etalon_2[0x12] = '%';
  hash_etalon_2[0x13] = '%';
  local_78[0] = ' ';
  local_78[1] = 'y';
  local_78[2] = 'F';
  local_78[3] = 'U';
  local_78[4] = 0x98;
  local_78[5] = '\f';
  local_78[6] = 0x91;
  local_78[7] = 0xd8;
  hash_etalon_3[0] = 0xbb;
  hash_etalon_3[1] = 0xb4;
  hash_etalon_3[2] = 0xc1;
  hash_etalon_3[3] = 0xea;
  hash_etalon_3[4] = 0x97;
  hash_etalon_3[5] = 'a';
  hash_etalon_3[6] = 0x8a;
  hash_etalon_3[7] = 'K';
  hash_etalon_3[8] = 0xf0;
  hash_etalon_3[9] = '?';
  hash_etalon_3[10] = 'B';
  hash_etalon_3[0xb] = 'X';
  hash_etalon_3[0xc] = '\x19';
  hash_etalon_3[0xd] = 'H';
  hash_etalon_3[0xe] = 0xb2;
  hash_etalon_3[0xf] = 0xee;
  hash_etalon_3[0x10] = 'N';
  hash_etalon_3[0x11] = 0xe7;
  hash_etalon_3[0x12] = 0xad;
  hash_etalon_3[0x13] = 'g';
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_SHA2_224,0x1c,"abc",
                    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",hash_etalon_2 + 0x18,
                    hash_etalon_3 + 0x18,local_78,
                    "23097d223405d8228642a477bda255b32aadbce4bda0b3f7e36c9da7",
                    "75388b16512776cc5dba5da1fd890150b0c6455cb4f58b1952522525",
                    "20794655980c91d8bbb4c1ea97618a4bf03f42581948b2ee4ee7ad67",
                    "4cf3d45b57e0d54981c4d86954e8378168d5a9f6ceab9e0aae5dd2f6");
  p_libsys_shutdown();
  pVar1 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

P_TEST_CASE_BEGIN (sha2_224_test)
{
	const puchar	hash_etalon_1[] = { 35,   9, 125,  34,  52,   5, 216,  34, 134,  66,
					   164, 119, 189, 162,  85, 179,  42, 173, 188, 228,
					   189, 160, 179, 247, 227, 108, 157, 167};
	const puchar	hash_etalon_2[] = {117,  56, 139,  22,  81,  39, 118, 204,  93, 186,
					    93, 161, 253, 137,   1,  80, 176, 198,  69,  92,
					   180, 245, 139,  25,  82,  82,  37,  37};
	const puchar	hash_etalon_3[] = { 32, 121,  70,  85, 152,  12, 145, 216, 187, 180,
					   193, 234, 151,  97, 138,  75, 240,  63,  66,  88,
					    25,  72, 178, 238,  78, 231, 173, 103, };

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_SHA2_224,
			   28,
			   "abc",
			   "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "23097d223405d8228642a477bda255b32aadbce4bda0b3f7e36c9da7",
			   "75388b16512776cc5dba5da1fd890150b0c6455cb4f58b1952522525",
			   "20794655980c91d8bbb4c1ea97618a4bf03f42581948b2ee4ee7ad67",
			   "4cf3d45b57e0d54981c4d86954e8378168d5a9f6ceab9e0aae5dd2f6");

	p_libsys_shutdown ();
}